

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

bool __thiscall
el::base::utils::
AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
::operator!=(AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *this,AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   *other)

{
  value_type pCVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppCVar4;
  const_reference ppCVar5;
  size_t i;
  ulong __n;
  bool bVar6;
  
  iVar2 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[10])();
  iVar3 = (*(other->super_ThreadSafe)._vptr_ThreadSafe[10])(other);
  bVar6 = true;
  if (CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3)) {
    __n = 0;
    do {
      bVar6 = __n < (ulong)(*(long *)&this->field_0x18 - *(long *)&this->m_list >> 3);
      if (!bVar6) {
        return bVar6;
      }
      ppCVar4 = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::at
                          ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                           &this->m_list,__n);
      pCVar1 = *ppCVar4;
      ppCVar5 = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::at
                          ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                           &other->m_list,__n);
      __n = __n + 1;
    } while (pCVar1 == *ppCVar5);
  }
  return bVar6;
}

Assistant:

bool operator!=(const AbstractRegistry<T_Ptr, Container>& other) {
    if (size() != other.size()) {
      return true;
    }
    for (std::size_t i = 0; i < m_list.size(); ++i) {
      if (m_list.at(i) != other.m_list.at(i)) {
        return true;
      }
    }
    return false;
  }